

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorld.cpp
# Opt level: O1

void __thiscall
btBridgedManifoldResult::addContactPoint
          (btBridgedManifoldResult *this,btVector3 *normalOnBInWorld,btVector3 *pointInWorld,
          btScalar depth)

{
  undefined4 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  btCollisionObject *pbVar6;
  btCollisionObject *pbVar7;
  btCollisionObjectWrapper *pbVar8;
  btCollisionObjectWrapper *pbVar9;
  int *piVar10;
  btCollisionObject *pbVar11;
  btCollisionObjectWrapper *pbVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  btManifoldPoint newPt;
  undefined1 local_c0 [16];
  undefined1 local_b0 [16];
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined1 local_90 [16];
  btScalar local_80;
  btScalar bStack_7c;
  btScalar bStack_78;
  btScalar bStack_74;
  btScalar local_70;
  undefined8 local_6c;
  undefined4 local_64;
  ulong local_60;
  int local_58;
  int local_54;
  undefined8 local_50;
  undefined1 local_48;
  undefined8 local_44;
  undefined8 uStack_3c;
  undefined8 local_34;
  undefined8 uStack_2c;
  
  pbVar6 = ((this->super_btManifoldResult).m_manifoldPtr)->m_body0;
  pbVar7 = ((this->super_btManifoldResult).m_body0Wrap)->m_collisionObject;
  fVar16 = (float)*(undefined8 *)pointInWorld->m_floats;
  fVar15 = (float)((ulong)*(undefined8 *)pointInWorld->m_floats >> 0x20);
  fVar13 = depth * (float)*(undefined8 *)normalOnBInWorld->m_floats + fVar16;
  fVar14 = depth * (float)((ulong)*(undefined8 *)normalOnBInWorld->m_floats >> 0x20) + fVar15;
  fVar17 = normalOnBInWorld->m_floats[2] * depth + pointInWorld->m_floats[2];
  if (pbVar6 == pbVar7) {
    fVar22 = fVar14 - (pbVar7->m_worldTransform).m_origin.m_floats[1];
    fVar21 = fVar13 - (pbVar7->m_worldTransform).m_origin.m_floats[0];
    fVar18 = fVar17 - (pbVar7->m_worldTransform).m_origin.m_floats[2];
    uVar2 = *(undefined8 *)(pbVar7->m_worldTransform).m_basis.m_el[0].m_floats;
    uVar3 = *(undefined8 *)(pbVar7->m_worldTransform).m_basis.m_el[1].m_floats;
    uVar4 = *(undefined8 *)(pbVar7->m_worldTransform).m_basis.m_el[2].m_floats;
    fVar19 = fVar18 * (float)uVar4 + fVar21 * (float)uVar2 + fVar22 * (float)uVar3;
    fVar20 = fVar18 * (float)((ulong)uVar4 >> 0x20) +
             fVar21 * (float)((ulong)uVar2 >> 0x20) + fVar22 * (float)((ulong)uVar3 >> 0x20);
    fVar18 = fVar18 * (pbVar7->m_worldTransform).m_basis.m_el[2].m_floats[2] +
             fVar21 * (pbVar7->m_worldTransform).m_basis.m_el[0].m_floats[2] +
             fVar22 * (pbVar7->m_worldTransform).m_basis.m_el[1].m_floats[2];
    pbVar11 = ((this->super_btManifoldResult).m_body1Wrap)->m_collisionObject;
  }
  else {
    pbVar11 = ((this->super_btManifoldResult).m_body1Wrap)->m_collisionObject;
    fVar21 = fVar13 - (pbVar11->m_worldTransform).m_origin.m_floats[0];
    fVar22 = fVar14 - (pbVar11->m_worldTransform).m_origin.m_floats[1];
    fVar18 = fVar17 - (pbVar11->m_worldTransform).m_origin.m_floats[2];
    uVar2 = *(undefined8 *)(pbVar11->m_worldTransform).m_basis.m_el[0].m_floats;
    uVar3 = *(undefined8 *)(pbVar11->m_worldTransform).m_basis.m_el[1].m_floats;
    uVar4 = *(undefined8 *)(pbVar11->m_worldTransform).m_basis.m_el[2].m_floats;
    fVar19 = fVar18 * (float)uVar4 + fVar21 * (float)uVar2 + fVar22 * (float)uVar3;
    fVar20 = fVar18 * (float)((ulong)uVar4 >> 0x20) +
             fVar21 * (float)((ulong)uVar2 >> 0x20) + fVar22 * (float)((ulong)uVar3 >> 0x20);
    fVar18 = fVar18 * (pbVar11->m_worldTransform).m_basis.m_el[2].m_floats[2] +
             fVar21 * (pbVar11->m_worldTransform).m_basis.m_el[0].m_floats[2] +
             fVar22 * (pbVar11->m_worldTransform).m_basis.m_el[1].m_floats[2];
    pbVar11 = pbVar7;
  }
  fVar16 = fVar16 - (pbVar11->m_worldTransform).m_origin.m_floats[0];
  fVar15 = fVar15 - (pbVar11->m_worldTransform).m_origin.m_floats[1];
  fVar21 = pointInWorld->m_floats[2] - (pbVar11->m_worldTransform).m_origin.m_floats[2];
  uVar2 = *(undefined8 *)(pbVar11->m_worldTransform).m_basis.m_el[0].m_floats;
  uVar3 = *(undefined8 *)(pbVar11->m_worldTransform).m_basis.m_el[1].m_floats;
  uVar4 = *(undefined8 *)(pbVar11->m_worldTransform).m_basis.m_el[2].m_floats;
  local_c0._4_4_ = fVar20;
  local_c0._0_4_ = fVar19;
  local_c0._8_4_ = fVar18;
  local_c0._12_4_ = 0;
  local_b0._4_4_ =
       fVar21 * (float)((ulong)uVar4 >> 0x20) +
       fVar16 * (float)((ulong)uVar2 >> 0x20) + fVar15 * (float)((ulong)uVar3 >> 0x20);
  local_b0._0_4_ = fVar21 * (float)uVar4 + fVar16 * (float)uVar2 + fVar15 * (float)uVar3;
  local_b0._8_4_ =
       fVar21 * (pbVar11->m_worldTransform).m_basis.m_el[2].m_floats[2] +
       fVar16 * (pbVar11->m_worldTransform).m_basis.m_el[0].m_floats[2] +
       fVar15 * (pbVar11->m_worldTransform).m_basis.m_el[1].m_floats[2];
  local_b0._12_4_ = 0;
  local_80 = normalOnBInWorld->m_floats[0];
  bStack_7c = normalOnBInWorld->m_floats[1];
  bStack_78 = normalOnBInWorld->m_floats[2];
  bStack_74 = normalOnBInWorld->m_floats[3];
  local_6c = 0;
  local_64 = 0;
  local_50 = 0;
  local_48 = 0;
  local_44 = 0;
  uStack_3c = 0;
  local_34 = 0;
  uStack_2c = 0;
  local_90._4_4_ = fVar14;
  local_90._0_4_ = fVar13;
  local_90._8_4_ = fVar17;
  local_90._12_4_ = 0;
  local_a0 = *(undefined8 *)pointInWorld->m_floats;
  uStack_98 = *(undefined8 *)(pointInWorld->m_floats + 2);
  if (pbVar6 == pbVar7) {
    local_60._0_4_ = (this->super_btManifoldResult).m_partId0;
    local_60._4_4_ = (this->super_btManifoldResult).m_partId1;
    local_58 = (this->super_btManifoldResult).m_index0;
    piVar10 = &(this->super_btManifoldResult).m_index1;
  }
  else {
    uVar1 = (this->super_btManifoldResult).m_partId0;
    uVar5 = (this->super_btManifoldResult).m_partId1;
    local_60 = CONCAT44(uVar1,uVar5);
    local_58 = (this->super_btManifoldResult).m_index1;
    piVar10 = &(this->super_btManifoldResult).m_index0;
  }
  local_54 = *piVar10;
  pbVar8 = (this->super_btManifoldResult).m_body0Wrap;
  pbVar9 = (this->super_btManifoldResult).m_body1Wrap;
  pbVar12 = pbVar8;
  if (pbVar6 == pbVar7) {
    pbVar12 = pbVar9;
    pbVar9 = pbVar8;
  }
  local_70 = depth;
  (**(code **)(*(long *)this->m_resultCallback + 0x18))
            (this->m_resultCallback,local_c0,pbVar9,local_60 & 0xffffffff,local_58,pbVar12,
             local_60 >> 0x20,local_54);
  return;
}

Assistant:

virtual void addContactPoint(const btVector3& normalOnBInWorld,const btVector3& pointInWorld,btScalar depth)
	{
		bool isSwapped = m_manifoldPtr->getBody0() != m_body0Wrap->getCollisionObject();
		btVector3 pointA = pointInWorld + normalOnBInWorld * depth;
		btVector3 localA;
		btVector3 localB;
		if (isSwapped)
		{
			localA = m_body1Wrap->getCollisionObject()->getWorldTransform().invXform(pointA );
			localB = m_body0Wrap->getCollisionObject()->getWorldTransform().invXform(pointInWorld);
		} else
		{
			localA = m_body0Wrap->getCollisionObject()->getWorldTransform().invXform(pointA );
			localB = m_body1Wrap->getCollisionObject()->getWorldTransform().invXform(pointInWorld);
		}
		
		btManifoldPoint newPt(localA,localB,normalOnBInWorld,depth);
		newPt.m_positionWorldOnA = pointA;
		newPt.m_positionWorldOnB = pointInWorld;
		
	   //BP mod, store contact triangles.
		if (isSwapped)
		{
			newPt.m_partId0 = m_partId1;
			newPt.m_partId1 = m_partId0;
			newPt.m_index0  = m_index1;
			newPt.m_index1  = m_index0;
		} else
		{
			newPt.m_partId0 = m_partId0;
			newPt.m_partId1 = m_partId1;
			newPt.m_index0  = m_index0;
			newPt.m_index1  = m_index1;
		}

		//experimental feature info, for per-triangle material etc.
		const btCollisionObjectWrapper* obj0Wrap = isSwapped? m_body1Wrap : m_body0Wrap;
		const btCollisionObjectWrapper* obj1Wrap = isSwapped? m_body0Wrap : m_body1Wrap;
		m_resultCallback.addSingleResult(newPt,obj0Wrap,newPt.m_partId0,newPt.m_index0,obj1Wrap,newPt.m_partId1,newPt.m_index1);

	}